

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzReadFileNames(Byte *data,size_t size,UInt32 numFiles,size_t *offsets)

{
  bool bVar1;
  Byte *p;
  size_t pos;
  size_t *offsets_local;
  UInt32 numFiles_local;
  size_t size_local;
  Byte *data_local;
  SRes local_4;
  
  pos = 0;
  offsets_local = offsets + 1;
  *offsets = 0;
  if (numFiles == 0) {
    local_4 = 0x10;
    if (size == 0) {
      local_4 = 0;
    }
  }
  else if (size < 2) {
    local_4 = 0x10;
  }
  else if ((data[size - 2] == '\0') && (numFiles_local = numFiles, data[size - 1] == '\0')) {
    do {
      if (pos == size) {
        return 0x10;
      }
      p = data + pos;
      while( true ) {
        bVar1 = true;
        if (*p == '\0') {
          bVar1 = p[1] != '\0';
        }
        if (!bVar1) break;
        p = p + 2;
      }
      pos = (size_t)(p + (2 - (long)data));
      *offsets_local = pos >> 1;
      numFiles_local = numFiles_local - 1;
      offsets_local = offsets_local + 1;
    } while (numFiles_local != 0);
    local_4 = 0x10;
    if (pos == size) {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x10;
  }
  return local_4;
}

Assistant:

static SRes SzReadFileNames(const Byte *data, size_t size, UInt32 numFiles, size_t *offsets)
{
  size_t pos = 0;
  *offsets++ = 0;
  if (numFiles == 0)
    return (size == 0) ? SZ_OK : SZ_ERROR_ARCHIVE;
  if (size < 2)
    return SZ_ERROR_ARCHIVE;
  if (data[size - 2] != 0 || data[size - 1] != 0)
    return SZ_ERROR_ARCHIVE;
  do
  {
    const Byte *p;
    if (pos == size)
      return SZ_ERROR_ARCHIVE;
    for (p = data + pos;
      #ifdef _WIN32
      *(const UInt16 *)p != 0
      #else
      p[0] != 0 || p[1] != 0
      #endif
      ; p += 2);
    pos = p - data + 2;
    *offsets++ = (pos >> 1);
  }
  while (--numFiles);
  return (pos == size) ? SZ_OK : SZ_ERROR_ARCHIVE;
}